

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall wallet::CKeyPool::CKeyPool(CKeyPool *this,CPubKey *vchPubKeyIn,bool internalIn)

{
  long lVar1;
  int64_t iVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->vchPubKey).vch[0] = 0xff;
  iVar2 = GetTime();
  this->nTime = iVar2;
  memcpy(&this->vchPubKey,vchPubKeyIn,0x41);
  this->fInternal = internalIn;
  this->m_pre_split = false;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

CKeyPool::CKeyPool(const CPubKey& vchPubKeyIn, bool internalIn)
{
    nTime = GetTime();
    vchPubKey = vchPubKeyIn;
    fInternal = internalIn;
    m_pre_split = false;
}